

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O1

int mbedtls_hmac_drbg_update_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  int iVar1;
  FILE *__stream;
  ulong __n;
  size_t sVar2;
  long lVar3;
  uchar buf [256];
  uchar local_138 [264];
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -7;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if (__n < 0x101) {
      sVar2 = fread(local_138,1,__n,__stream);
      iVar1 = -7;
      if (sVar2 == __n) {
        mbedtls_hmac_drbg_update(ctx,local_138,__n);
        iVar1 = 0;
      }
      fclose(__stream);
      lVar3 = 0;
      do {
        local_138[lVar3] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
      if (sVar2 == __n) {
        iVar1 = mbedtls_hmac_drbg_write_seed_file(ctx,path);
      }
    }
    else {
      fclose(__stream);
      iVar1 = -5;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_update_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    int ret = 0;
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_HMAC_DRBG_MAX_INPUT )
    {
        fclose( f );
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    if( fread( buf, 1, n, f ) != n )
        ret = MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR;
    else
        mbedtls_hmac_drbg_update( ctx, buf, n );

    fclose( f );

    mbedtls_zeroize( buf, sizeof( buf ) );

    if( ret != 0 )
        return( ret );

    return( mbedtls_hmac_drbg_write_seed_file( ctx, path ) );
}